

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O3

LY_ERR lyd_insert_hash_add(ly_ht *ht,lyd_node *node,ly_bool empty_ht)

{
  lysc_node *plVar1;
  char *pcVar2;
  LY_ERR LVar3;
  uint32_t uVar4;
  size_t sVar5;
  lys_module *plVar6;
  undefined8 uVar7;
  lyd_node *local_28;
  
  local_28 = node;
  if (((ht == (ly_ht *)0x0) || (node == (lyd_node *)0x0)) || (node->schema == (lysc_node *)0x0)) {
    __assert_fail("ht && node && node->schema",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                  ,0x80,"LY_ERR lyd_insert_hash_add(struct ly_ht *, struct lyd_node *, ly_bool)");
  }
  LVar3 = lyht_insert_no_check(ht,&local_28,node->hash,(void **)0x0);
  plVar1 = local_28->schema;
  if (LVar3 == LY_SUCCESS) {
    if ((plVar1->nodetype & 0x18) == 0) {
      return LY_SUCCESS;
    }
    if ((local_28->prev->next != (lyd_node *)0x0) && (local_28->prev->schema == plVar1)) {
      return LY_SUCCESS;
    }
    pcVar2 = plVar1->module->name;
    sVar5 = strlen(pcVar2);
    uVar4 = lyht_hash_multi(0,pcVar2,sVar5);
    pcVar2 = local_28->schema->name;
    sVar5 = strlen(pcVar2);
    uVar4 = lyht_hash_multi(uVar4,pcVar2,sVar5);
    uVar4 = lyht_hash_multi(uVar4,(char *)0x0,0);
    if (((empty_ht == '\0') && (local_28->next != (lyd_node *)0x0)) &&
       ((local_28->next->schema == local_28->schema &&
        (LVar3 = lyht_remove(ht,&local_28->next,uVar4), LVar3 != LY_SUCCESS)))) {
      if (local_28->schema == (lysc_node *)0x0) {
        plVar6 = (lys_module *)&local_28[2].schema;
      }
      else {
        plVar6 = local_28->schema->module;
      }
      uVar7 = 0x92;
    }
    else {
      if (uVar4 == local_28->hash) {
        __assert_fail("hash != node->hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                      ,0x97,"LY_ERR lyd_insert_hash_add(struct ly_ht *, struct lyd_node *, ly_bool)"
                     );
      }
      LVar3 = lyht_insert(ht,&local_28,uVar4,(void **)0x0);
      if (LVar3 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      if (local_28->schema == (lysc_node *)0x0) {
        plVar6 = (lys_module *)&local_28[2].schema;
      }
      else {
        plVar6 = local_28->schema->module;
      }
      uVar7 = 0x9b;
    }
  }
  else {
    if (plVar1 == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&local_28[2].schema;
    }
    else {
      plVar6 = plVar1->module;
    }
    uVar7 = 0x84;
  }
  ly_log(plVar6->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c",
         uVar7);
  return LY_EINT;
}

Assistant:

static LY_ERR
lyd_insert_hash_add(struct ly_ht *ht, struct lyd_node *node, ly_bool empty_ht)
{
    uint32_t hash;

    assert(ht && node && node->schema);

    /* add node itself */
    if (lyht_insert_no_check(ht, &node, node->hash, NULL)) {
        LOGINT_RET(LYD_CTX(node));
    }

    /* add first instance of a (leaf-)list */
    if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) &&
            (!node->prev->next || (node->prev->schema != node->schema))) {
        /* get the simple hash */
        hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
        hash = lyht_hash_multi(hash, node->schema->name, strlen(node->schema->name));
        hash = lyht_hash_multi(hash, NULL, 0);

        /* remove any previous stored instance, only if we did not start with an empty HT */
        if (!empty_ht && node->next && (node->next->schema == node->schema)) {
            if (lyht_remove(ht, &node->next, hash)) {
                LOGINT_RET(LYD_CTX(node));
            }
        }

        /* in this case there would be the exact same value twice in the hash table, not supported (by the HT) */
        assert(hash != node->hash);

        /* insert this instance as the first (leaf-)list instance */
        if (lyht_insert(ht, &node, hash, NULL)) {
            LOGINT_RET(LYD_CTX(node));
        }
    }

    return LY_SUCCESS;
}